

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

unsigned_long
libssh2_channel_receive_window_adjust(LIBSSH2_CHANNEL *channel,unsigned_long adj,uchar force)

{
  time_t start_time;
  LIBSSH2_CHANNEL *local_40;
  time_t entry_time;
  uint local_28;
  int rc;
  uint window;
  uchar force_local;
  unsigned_long adj_local;
  LIBSSH2_CHANNEL *channel_local;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    channel_local = (LIBSSH2_CHANNEL *)0xffffffffffffffd9;
  }
  else {
    rc._3_1_ = force;
    _window = adj;
    adj_local = (unsigned_long)channel;
    start_time = time((time_t *)0x0);
    do {
      entry_time._4_4_ =
           _libssh2_channel_receive_window_adjust
                     ((LIBSSH2_CHANNEL *)adj_local,(uint32_t)_window,rc._3_1_,&local_28);
      if ((entry_time._4_4_ != -0x25) || (*(int *)(*(long *)(adj_local + 0x68) + 0xac) == 0)) break;
      entry_time._4_4_ = _libssh2_wait_socket(*(LIBSSH2_SESSION **)(adj_local + 0x68),start_time);
    } while (entry_time._4_4_ == 0);
    if (entry_time._4_4_ == 0) {
      local_40 = (LIBSSH2_CHANNEL *)(ulong)local_28;
    }
    else {
      local_40 = (LIBSSH2_CHANNEL *)(long)entry_time._4_4_;
    }
    channel_local = local_40;
  }
  return (unsigned_long)channel_local;
}

Assistant:

LIBSSH2_API unsigned long
libssh2_channel_receive_window_adjust(LIBSSH2_CHANNEL *channel,
                                      unsigned long adj,
                                      unsigned char force)
{
    unsigned int window;
    int rc;

    if(!channel)
        return (unsigned long)LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 _libssh2_channel_receive_window_adjust(channel,
                                                        (uint32_t)adj,
                                                        force, &window));

    /* stupid - but this is how it was made to work before and this is just
       kept for backwards compatibility */
    return rc ? (unsigned long)rc : window;
}